

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_util.cpp
# Opt level: O3

Error * ot::commissioner::ReadPemFile
                  (Error *__return_storage_ptr__,ByteArray *aData,string *aFilename)

{
  pointer *ppuVar1;
  ErrorCode EVar2;
  pointer puVar3;
  iterator __position;
  string str;
  allocator_type local_89;
  undefined1 local_88 [8];
  _Alloc_hider _Stack_80;
  pointer local_78;
  uchar local_70 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  string local_50;
  
  __return_storage_ptr__->mCode = kNone;
  local_58 = &(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p = (pointer)local_58;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  ReadFile((Error *)local_88,&local_50,aFilename);
  __return_storage_ptr__->mCode = local_88._0_4_;
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->mMessage,(string *)&_Stack_80);
  EVar2 = __return_storage_ptr__->mCode;
  if ((uchar *)_Stack_80._M_p != local_70) {
    operator_delete(_Stack_80._M_p);
  }
  if (EVar2 == kNone) {
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    vector<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_88,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )local_50._M_dataplus._M_p,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )(local_50._M_dataplus._M_p + local_50._M_string_length),&local_89);
    puVar3 = (aData->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    (aData->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_88;
    (aData->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)_Stack_80._M_p;
    (aData->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = local_78;
    local_88 = (undefined1  [8])0x0;
    _Stack_80._M_p = (pointer)0x0;
    local_78 = (pointer)0x0;
    if (puVar3 != (pointer)0x0) {
      operator_delete(puVar3);
      if (local_88 != (undefined1  [8])0x0) {
        operator_delete((void *)local_88);
      }
    }
    local_88 = (undefined1  [8])((ulong)local_88 & 0xffffffffffffff00);
    __position._M_current =
         (aData->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (aData->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_realloc_insert<unsigned_char>
                (aData,__position,local_88);
    }
    else {
      *__position._M_current = '\0';
      ppuVar1 = &(aData->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppuVar1 = *ppuVar1 + 1;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

Error ReadPemFile(ByteArray &aData, const std::string &aFilename)
{
    Error error;

    std::string str;

    SuccessOrExit(error = ReadFile(str, aFilename));

    aData = {str.begin(), str.end()};
    aData.push_back('\0');

exit:
    return error;
}